

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Imputer::clear_ImputedValue(Imputer *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  Int64ToDoubleMap *this_00;
  ulong uStack_20;
  
  switch(this->_oneof_case_[0]) {
  case 3:
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&this->ImputedValue_,puVar2);
    goto switchD_001a54e4_default;
  case 4:
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto switchD_001a54e4_default;
    this_00 = (Int64ToDoubleMap *)(this->ImputedValue_).imputeddoublearray_;
    if (this_00 != (Int64ToDoubleMap *)0x0) {
      DoubleVector::~DoubleVector((DoubleVector *)this_00);
    }
    break;
  case 5:
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto switchD_001a54e4_default;
    this_00 = (Int64ToDoubleMap *)(this->ImputedValue_).imputedint64array_;
    if (this_00 != (Int64ToDoubleMap *)0x0) {
      Int64Vector::~Int64Vector((Int64Vector *)this_00);
    }
    break;
  case 6:
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto switchD_001a54e4_default;
    this_00 = (Int64ToDoubleMap *)(this->ImputedValue_).imputedstringdictionary_;
    if (this_00 != (Int64ToDoubleMap *)0x0) {
      StringToDoubleMap::~StringToDoubleMap((StringToDoubleMap *)this_00);
    }
    goto LAB_001a5589;
  case 7:
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto switchD_001a54e4_default;
    this_00 = (this->ImputedValue_).imputedint64dictionary_;
    if (this_00 != (Int64ToDoubleMap *)0x0) {
      Int64ToDoubleMap::~Int64ToDoubleMap(this_00);
    }
LAB_001a5589:
    uStack_20 = 0x48;
    goto LAB_001a55b5;
  default:
    goto switchD_001a54e4_default;
  }
  uStack_20 = 0x28;
LAB_001a55b5:
  operator_delete(this_00,uStack_20);
switchD_001a54e4_default:
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Imputer::clear_ImputedValue() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Imputer)
  switch (ImputedValue_case()) {
    case kImputedDoubleValue: {
      // No need to clear
      break;
    }
    case kImputedInt64Value: {
      // No need to clear
      break;
    }
    case kImputedStringValue: {
      ImputedValue_.imputedstringvalue_.Destroy(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, GetArenaForAllocation());
      break;
    }
    case kImputedDoubleArray: {
      if (GetArenaForAllocation() == nullptr) {
        delete ImputedValue_.imputeddoublearray_;
      }
      break;
    }
    case kImputedInt64Array: {
      if (GetArenaForAllocation() == nullptr) {
        delete ImputedValue_.imputedint64array_;
      }
      break;
    }
    case kImputedStringDictionary: {
      if (GetArenaForAllocation() == nullptr) {
        delete ImputedValue_.imputedstringdictionary_;
      }
      break;
    }
    case kImputedInt64Dictionary: {
      if (GetArenaForAllocation() == nullptr) {
        delete ImputedValue_.imputedint64dictionary_;
      }
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = IMPUTEDVALUE_NOT_SET;
}